

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_3_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_700;
  float c2s;
  float *output2;
  float *pfStack_6f0;
  float c1s;
  float *output1;
  float *pfStack_6e0;
  float c0s;
  float *output0;
  float *input_end_local;
  float *input_local;
  float *vertical_coefficients_local;
  float **outputs_local;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  
  pfStack_6e0 = *outputs;
  fVar1 = *vertical_coefficients;
  pfStack_6f0 = outputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_700 = outputs[2];
  fVar3 = vertical_coefficients[2];
  for (input_end_local = input; 0x3f < (long)input_end - (long)input_end_local;
      input_end_local = input_end_local + 0x10) {
    local_268 = (float)*(undefined8 *)input_end_local;
    fStack_264 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_260 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_25c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_88 = (float)*(undefined8 *)pfStack_6e0;
    fStack_84 = (float)((ulong)*(undefined8 *)pfStack_6e0 >> 0x20);
    fStack_80 = (float)*(undefined8 *)(pfStack_6e0 + 2);
    fStack_7c = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 2) >> 0x20);
    o1[3] = fStack_84 + fStack_264 * fVar1;
    o1[2] = local_88 + local_268 * fVar1;
    o0[1] = fStack_7c + fStack_25c * fVar1;
    o0[0] = fStack_80 + fStack_260 * fVar1;
    local_288 = (float)*(undefined8 *)(input_end_local + 4);
    fStack_284 = (float)((ulong)*(undefined8 *)(input_end_local + 4) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(input_end_local + 6);
    fStack_27c = (float)((ulong)*(undefined8 *)(input_end_local + 6) >> 0x20);
    local_a8 = (float)*(undefined8 *)(pfStack_6e0 + 4);
    fStack_a4 = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 4) >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(pfStack_6e0 + 6);
    fStack_9c = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 6) >> 0x20);
    o2[3] = fStack_a4 + fStack_284 * fVar1;
    o2[2] = local_a8 + local_288 * fVar1;
    o1[1] = fStack_9c + fStack_27c * fVar1;
    o1[0] = fStack_a0 + fStack_280 * fVar1;
    local_2a8 = (float)*(undefined8 *)(input_end_local + 8);
    fStack_2a4 = (float)((ulong)*(undefined8 *)(input_end_local + 8) >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(input_end_local + 10);
    fStack_29c = (float)((ulong)*(undefined8 *)(input_end_local + 10) >> 0x20);
    local_c8 = (float)*(undefined8 *)(pfStack_6e0 + 8);
    fStack_c4 = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 8) >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(pfStack_6e0 + 10);
    fStack_bc = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 10) >> 0x20);
    o3[3] = fStack_c4 + fStack_2a4 * fVar1;
    o3[2] = local_c8 + local_2a8 * fVar1;
    o2[1] = fStack_bc + fStack_29c * fVar1;
    o2[0] = fStack_c0 + fStack_2a0 * fVar1;
    local_2c8 = (float)*(undefined8 *)(input_end_local + 0xc);
    fStack_2c4 = (float)((ulong)*(undefined8 *)(input_end_local + 0xc) >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)(input_end_local + 0xe);
    fStack_2bc = (float)((ulong)*(undefined8 *)(input_end_local + 0xe) >> 0x20);
    local_e8 = (float)*(undefined8 *)(pfStack_6e0 + 0xc);
    fStack_e4 = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 0xc) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfStack_6e0 + 0xe);
    fStack_dc = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 0xe) >> 0x20);
    r0[3] = fStack_e4 + fStack_2c4 * fVar1;
    r0[2] = local_e8 + local_2c8 * fVar1;
    o3[1] = fStack_dc + fStack_2bc * fVar1;
    o3[0] = fStack_e0 + fStack_2c0 * fVar1;
    *(undefined8 *)pfStack_6e0 = o1._8_8_;
    *(undefined8 *)(pfStack_6e0 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_6e0 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_6e0 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_6e0 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_6e0 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_6e0 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_6e0 + 0xe) = o3._0_8_;
    local_108 = (float)*(undefined8 *)pfStack_6f0;
    fStack_104 = (float)((ulong)*(undefined8 *)pfStack_6f0 >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfStack_6f0 + 2);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 2) >> 0x20);
    o1[3] = fStack_104 + fStack_264 * fVar2;
    o1[2] = local_108 + local_268 * fVar2;
    o0[1] = fStack_fc + fStack_25c * fVar2;
    o0[0] = fStack_100 + fStack_260 * fVar2;
    local_128 = (float)*(undefined8 *)(pfStack_6f0 + 4);
    fStack_124 = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 4) >> 0x20);
    fStack_120 = (float)*(undefined8 *)(pfStack_6f0 + 6);
    fStack_11c = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 6) >> 0x20);
    o2[3] = fStack_124 + fStack_284 * fVar2;
    o2[2] = local_128 + local_288 * fVar2;
    o1[1] = fStack_11c + fStack_27c * fVar2;
    o1[0] = fStack_120 + fStack_280 * fVar2;
    local_148 = (float)*(undefined8 *)(pfStack_6f0 + 8);
    fStack_144 = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 8) >> 0x20);
    fStack_140 = (float)*(undefined8 *)(pfStack_6f0 + 10);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 10) >> 0x20);
    o3[3] = fStack_144 + fStack_2a4 * fVar2;
    o3[2] = local_148 + local_2a8 * fVar2;
    o2[1] = fStack_13c + fStack_29c * fVar2;
    o2[0] = fStack_140 + fStack_2a0 * fVar2;
    local_168 = (float)*(undefined8 *)(pfStack_6f0 + 0xc);
    fStack_164 = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 0xc) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfStack_6f0 + 0xe);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 0xe) >> 0x20);
    r0[3] = fStack_164 + fStack_2c4 * fVar2;
    r0[2] = local_168 + local_2c8 * fVar2;
    o3[1] = fStack_15c + fStack_2bc * fVar2;
    o3[0] = fStack_160 + fStack_2c0 * fVar2;
    *(undefined8 *)pfStack_6f0 = o1._8_8_;
    *(undefined8 *)(pfStack_6f0 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_6f0 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_6f0 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_6f0 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_6f0 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_6f0 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_6f0 + 0xe) = o3._0_8_;
    local_188 = (float)*(undefined8 *)pfStack_700;
    fStack_184 = (float)((ulong)*(undefined8 *)pfStack_700 >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfStack_700 + 2);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfStack_700 + 2) >> 0x20);
    o1[3] = fStack_184 + fStack_264 * fVar3;
    o1[2] = local_188 + local_268 * fVar3;
    o0[1] = fStack_17c + fStack_25c * fVar3;
    o0[0] = fStack_180 + fStack_260 * fVar3;
    local_1a8 = (float)*(undefined8 *)(pfStack_700 + 4);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfStack_700 + 4) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfStack_700 + 6);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfStack_700 + 6) >> 0x20);
    o2[3] = fStack_1a4 + fStack_284 * fVar3;
    o2[2] = local_1a8 + local_288 * fVar3;
    o1[1] = fStack_19c + fStack_27c * fVar3;
    o1[0] = fStack_1a0 + fStack_280 * fVar3;
    local_1c8 = (float)*(undefined8 *)(pfStack_700 + 8);
    fStack_1c4 = (float)((ulong)*(undefined8 *)(pfStack_700 + 8) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(pfStack_700 + 10);
    fStack_1bc = (float)((ulong)*(undefined8 *)(pfStack_700 + 10) >> 0x20);
    o3[3] = fStack_1c4 + fStack_2a4 * fVar3;
    o3[2] = local_1c8 + local_2a8 * fVar3;
    o2[1] = fStack_1bc + fStack_29c * fVar3;
    o2[0] = fStack_1c0 + fStack_2a0 * fVar3;
    local_1e8 = (float)*(undefined8 *)(pfStack_700 + 0xc);
    fStack_1e4 = (float)((ulong)*(undefined8 *)(pfStack_700 + 0xc) >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)(pfStack_700 + 0xe);
    fStack_1dc = (float)((ulong)*(undefined8 *)(pfStack_700 + 0xe) >> 0x20);
    r0[3] = fStack_1e4 + fStack_2c4 * fVar3;
    r0[2] = local_1e8 + local_2c8 * fVar3;
    o3[1] = fStack_1dc + fStack_2bc * fVar3;
    o3[0] = fStack_1e0 + fStack_2c0 * fVar3;
    *(undefined8 *)pfStack_700 = o1._8_8_;
    *(undefined8 *)(pfStack_700 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_700 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_700 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_700 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_700 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_700 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_700 + 0xe) = o3._0_8_;
    pfStack_6e0 = pfStack_6e0 + 0x10;
    pfStack_6f0 = pfStack_6f0 + 0x10;
    pfStack_700 = pfStack_700 + 0x10;
  }
  for (; 0xf < (long)input_end - (long)input_end_local; input_end_local = input_end_local + 4) {
    local_3e8 = (float)*(undefined8 *)input_end_local;
    fStack_3e4 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_3e0 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_3dc = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_208 = (float)*(undefined8 *)pfStack_6e0;
    fStack_204 = (float)((ulong)*(undefined8 *)pfStack_6e0 >> 0x20);
    fStack_200 = (float)*(undefined8 *)(pfStack_6e0 + 2);
    fStack_1fc = (float)((ulong)*(undefined8 *)(pfStack_6e0 + 2) >> 0x20);
    r0_1[3] = fStack_204 + fStack_3e4 * fVar1;
    r0_1[2] = local_208 + local_3e8 * fVar1;
    o0_1[1] = fStack_1fc + fStack_3dc * fVar1;
    o0_1[0] = fStack_200 + fStack_3e0 * fVar1;
    *(undefined8 *)pfStack_6e0 = r0_1._8_8_;
    *(undefined8 *)(pfStack_6e0 + 2) = o0_1._0_8_;
    local_228 = (float)*(undefined8 *)pfStack_6f0;
    fStack_224 = (float)((ulong)*(undefined8 *)pfStack_6f0 >> 0x20);
    fStack_220 = (float)*(undefined8 *)(pfStack_6f0 + 2);
    fStack_21c = (float)((ulong)*(undefined8 *)(pfStack_6f0 + 2) >> 0x20);
    r0_1[3] = fStack_224 + fStack_3e4 * fVar2;
    r0_1[2] = local_228 + local_3e8 * fVar2;
    o0_1[1] = fStack_21c + fStack_3dc * fVar2;
    o0_1[0] = fStack_220 + fStack_3e0 * fVar2;
    *(undefined8 *)pfStack_6f0 = r0_1._8_8_;
    *(undefined8 *)(pfStack_6f0 + 2) = o0_1._0_8_;
    local_248 = (float)*(undefined8 *)pfStack_700;
    fStack_244 = (float)((ulong)*(undefined8 *)pfStack_700 >> 0x20);
    fStack_240 = (float)*(undefined8 *)(pfStack_700 + 2);
    fStack_23c = (float)((ulong)*(undefined8 *)(pfStack_700 + 2) >> 0x20);
    r0_1[3] = fStack_244 + fStack_3e4 * fVar3;
    r0_1[2] = local_248 + local_3e8 * fVar3;
    o0_1[1] = fStack_23c + fStack_3dc * fVar3;
    o0_1[0] = fStack_240 + fStack_3e0 * fVar3;
    *(undefined8 *)pfStack_700 = r0_1._8_8_;
    *(undefined8 *)(pfStack_700 + 2) = o0_1._0_8_;
    pfStack_6e0 = pfStack_6e0 + 4;
    pfStack_6f0 = pfStack_6f0 + 4;
    pfStack_700 = pfStack_700 + 4;
  }
  for (; input_end_local < input_end; input_end_local = input_end_local + 1) {
    fVar4 = *input_end_local;
    *pfStack_6e0 = fVar4 * fVar1 + *pfStack_6e0;
    *pfStack_6f0 = fVar4 * fVar2 + *pfStack_6f0;
    *pfStack_700 = fVar4 * fVar3 + *pfStack_700;
    pfStack_6e0 = pfStack_6e0 + 1;
    pfStack_6f0 = pfStack_6f0 + 1;
    pfStack_700 = pfStack_700 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}